

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprc_identity(lys_ypr_ctx *pctx,lysc_ident *ident)

{
  uint16_t *puVar1;
  ly_bool *flag_00;
  lysc_ident **pplVar2;
  ly_out *out;
  LY_ERR LVar3;
  ulong in_RAX;
  lysc_ident *plVar4;
  ulong uVar5;
  uint uVar6;
  lysc_ident *plVar7;
  ly_bool flag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  uVar5 = 0;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
      (undefined1  [24])0x0) {
    uVar5 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
  }
  uVar6 = 0;
  ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",uVar5,"",ident->name);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprc_extension_instances(pctx,LY_STMT_IDENTITY,'\0',ident->exts,(ly_bool *)((long)&uStack_38 + 7))
  ;
  ypr_open((pctx->field_0).field_0.out,(ly_bool *)((long)&uStack_38 + 7));
  LVar3 = lys_identity_iffeature_value(ident);
  if (LVar3 == LY_ENOT) {
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar6 = (uint)(pctx->field_0).field_0.level * 2;
    }
    ly_print_((pctx->field_0).field_0.out,"%*s/* identity \"%s\" is disabled by if-feature(s) */\n",
              (ulong)uVar6,"",ident->name);
  }
  plVar7 = (lysc_ident *)0x0;
  while( true ) {
    pplVar2 = ident->derived;
    if (pplVar2 == (lysc_ident **)0x0) {
      plVar4 = (lysc_ident *)0x0;
    }
    else {
      plVar4 = pplVar2[-1];
    }
    if (plVar4 <= plVar7) break;
    plVar4 = pplVar2[(long)plVar7];
    out = (pctx->field_0).field_0.out;
    uVar6 = (pctx->field_0).field_0.options;
    if ((pctx->field_0).field_0.module == plVar4->module) {
      uVar5 = 0;
      if ((uVar6 & 2) == 0) {
        uVar5 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_(out,"%*sderived %s;\n",uVar5,"",plVar4->name);
    }
    else {
      uVar5 = 0;
      if ((uVar6 & 2) == 0) {
        uVar5 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_(out,"%*sderived %s:%s;\n",uVar5,"",plVar4->module->prefix,plVar4->name);
    }
    plVar7 = (lysc_ident *)((long)&plVar7->name + 1);
  }
  flag_00 = (ly_bool *)((long)&uStack_38 + 7);
  ypr_status(pctx,ident->flags,ident->exts,flag_00);
  ypr_description(pctx,ident->dsc,ident->exts,flag_00);
  ypr_reference(pctx,ident->ref,ident->exts,flag_00);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,uStack_38._7_1_);
  return;
}

Assistant:

static void
yprc_identity(struct lys_ypr_ctx *pctx, const struct lysc_ident *ident)
{
    ly_bool flag = 0;
    LY_ARRAY_COUNT_TYPE u;

    ly_print_(pctx->out, "%*sidentity %s", INDENT, ident->name);
    LEVEL++;

    yprc_extension_instances(pctx, LY_STMT_IDENTITY, 0, ident->exts, &flag);

    ypr_open(pctx->out, &flag);
    if (lys_identity_iffeature_value(ident) == LY_ENOT) {
        ly_print_(pctx->out, "%*s/* identity \"%s\" is disabled by if-feature(s) */\n", INDENT, ident->name);
    }

    LY_ARRAY_FOR(ident->derived, u) {
        if (pctx->module != ident->derived[u]->module) {
            ly_print_(pctx->out, "%*sderived %s:%s;\n", INDENT, ident->derived[u]->module->prefix, ident->derived[u]->name);
        } else {
            ly_print_(pctx->out, "%*sderived %s;\n", INDENT, ident->derived[u]->name);
        }
    }

    ypr_status(pctx, ident->flags, ident->exts, &flag);
    ypr_description(pctx, ident->dsc, ident->exts, &flag);
    ypr_reference(pctx, ident->ref, ident->exts, &flag);

    LEVEL--;
    ypr_close(pctx, flag);
}